

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O0

int anon_unknown.dwarf_1e6e5::ChannelOut_resetallcontrollers(lua_State *L)

{
  ChannelOut *this;
  ChannelOut *self;
  lua_State *L_local;
  
  this = getChannelOut(L,1);
  ChannelOut::send<int,int,int>(this,this->index + 0xb0,0x79,0);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_resetallcontrollers(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, 0x79, 0x00);
	lua_settop(L, 1);
	return 1;
}